

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Hop_Obj_t * Abc_ObjHopFromGia_rec(Hop_Man_t *pHopMan,Gia_Man_t *p,int Id,Vec_Ptr_t *vCopies)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *gFunc1;
  Hop_Obj_t *gFunc0;
  Hop_Obj_t *gFunc;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vCopies_local;
  int Id_local;
  Gia_Man_t *p_local;
  Hop_Man_t *pHopMan_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pObj_00 = Gia_ManObj(p,Id);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0x2a9,
                    "Hop_Obj_t *Abc_ObjHopFromGia_rec(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
    }
    iVar1 = Gia_ObjFaninId0(pObj_00,Id);
    pHVar2 = Abc_ObjHopFromGia_rec(pHopMan,p,iVar1,vCopies);
    iVar1 = Gia_ObjFaninId1(pObj_00,Id);
    pHVar3 = Abc_ObjHopFromGia_rec(pHopMan,p,iVar1,vCopies);
    iVar1 = Gia_ObjFaninC0(pObj_00);
    pHVar2 = Hop_NotCond(pHVar2,iVar1);
    iVar1 = Gia_ObjFaninC1(pObj_00);
    pHVar3 = Hop_NotCond(pHVar3,iVar1);
    pHopMan_local = (Hop_Man_t *)Hop_And(pHopMan,pHVar2,pHVar3);
    Vec_PtrWriteEntry(vCopies,Id,pHopMan_local);
  }
  else {
    pHopMan_local = (Hop_Man_t *)Vec_PtrEntry(vCopies,Id);
  }
  return (Hop_Obj_t *)pHopMan_local;
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia_rec( Hop_Man_t * pHopMan, Gia_Man_t * p, int Id, Vec_Ptr_t * vCopies )
{
    Gia_Obj_t * pObj;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return (Hop_Obj_t *)Vec_PtrEntry( vCopies, Id );
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj(p, Id);
    assert( Gia_ObjIsAnd(pObj) );
    // compute the functions of the children
    gFunc0 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId0(pObj, Id), vCopies );
    gFunc1 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId1(pObj, Id), vCopies );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, Gia_ObjFaninC0(pObj)), Hop_NotCond(gFunc1, Gia_ObjFaninC1(pObj)) );  
    Vec_PtrWriteEntry( vCopies, Id, gFunc );
    return gFunc;
}